

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O1

int __thiscall
axl::rc::Ptr<axl::rc::Box<axl::mem::Block>_>::copy
          (Ptr<axl::rc::Box<axl::mem::Block>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int32_t *piVar1;
  RefCount *pRVar2;
  int iVar3;
  uint uVar4;
  FreeFunc *in_RAX;
  
  iVar3 = (int)in_RAX;
  this->m_p = (Box<axl::mem::Block> *)dst;
  if (this->m_refCount != (RefCount *)src) {
    if (src != (EVP_PKEY_CTX *)0x0) {
      LOCK();
      *(int *)(src + 0x10) = *(int *)(src + 0x10) + 1;
      UNLOCK();
    }
    pRVar2 = this->m_refCount;
    if (pRVar2 != (RefCount *)0x0) {
      LOCK();
      piVar1 = &pRVar2->m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        uVar4 = (**pRVar2->_vptr_RefCount)(pRVar2);
        in_RAX = (FreeFunc *)(ulong)uVar4;
        LOCK();
        piVar1 = &pRVar2->m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (in_RAX = pRVar2->m_freeFunc, in_RAX != (FreeFunc *)0x0)) {
          in_RAX = (FreeFunc *)(*in_RAX)(pRVar2);
        }
      }
    }
    iVar3 = (int)in_RAX;
    this->m_refCount = (RefCount *)src;
  }
  return iVar3;
}

Assistant:

void
	copy(
		T* p,
		RefCount* refCount
	) {
		m_p = p;

		if (m_refCount == refCount)
			return;

		if (refCount)
			refCount->addRef();

		if (m_refCount)
			m_refCount->release();

		m_refCount = refCount;
	}